

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O3

GVariant * greetable_skeleton_dbus_interface_get_properties(GDBusInterfaceSkeleton *_skeleton)

{
  GType GVar1;
  gpointer user_data;
  undefined8 uVar2;
  gchar *sender;
  GDBusConnection *connection;
  GVariant *pGVar3;
  gchar *in_RCX;
  gchar *object_path;
  GVariantBuilder builder;
  undefined1 local_90 [128];
  
  GVar1 = greetable_skeleton_get_type();
  user_data = (gpointer)g_type_check_instance_cast(_skeleton,GVar1);
  uVar2 = g_variant_type_checked_("a{sv}");
  g_variant_builder_init(local_90,uVar2);
  sender = (gchar *)g_dbus_interface_skeleton_get_type();
  uVar2 = g_type_check_instance_cast(user_data,sender);
  g_dbus_interface_skeleton_get_connection(uVar2);
  connection = (GDBusConnection *)g_type_check_instance_cast(user_data);
  g_dbus_interface_skeleton_get_object_path();
  pGVar3 = _greetable_skeleton_handle_get_property
                     (connection,sender,object_path,in_RCX,"Greeting",(GError **)0x0,user_data);
  if (pGVar3 != (GVariant *)0x0) {
    g_variant_take_ref(pGVar3);
    g_variant_builder_add(local_90,"{sv}","Greeting",pGVar3);
    g_variant_unref(pGVar3);
  }
  pGVar3 = (GVariant *)g_variant_builder_end(local_90);
  return pGVar3;
}

Assistant:

static GVariant *
greetable_skeleton_dbus_interface_get_properties (GDBusInterfaceSkeleton *_skeleton)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (_skeleton);

  GVariantBuilder builder;
  guint n;
  g_variant_builder_init (&builder, G_VARIANT_TYPE ("a{sv}"));
  if (_greetable_interface_info.parent_struct.properties == NULL)
    goto out;
  for (n = 0; _greetable_interface_info.parent_struct.properties[n] != NULL; n++)
    {
      GDBusPropertyInfo *info = _greetable_interface_info.parent_struct.properties[n];
      if (info->flags & G_DBUS_PROPERTY_INFO_FLAGS_READABLE)
        {
          GVariant *value;
          value = _greetable_skeleton_handle_get_property (g_dbus_interface_skeleton_get_connection (G_DBUS_INTERFACE_SKELETON (skeleton)), NULL, g_dbus_interface_skeleton_get_object_path (G_DBUS_INTERFACE_SKELETON (skeleton)), "io.mangoh.Testing.Greetable", info->name, NULL, skeleton);
          if (value != NULL)
            {
              g_variant_take_ref (value);
              g_variant_builder_add (&builder, "{sv}", info->name, value);
              g_variant_unref (value);
            }
        }
    }
out:
  return g_variant_builder_end (&builder);
}